

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::ConditionalExpression::serializeTo
          (ConditionalExpression *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  reference pCVar2;
  Expression *pEVar3;
  ASTSerializer *in_RSI;
  ConditionalExpression *in_RDI;
  Condition *cond;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *__range2;
  span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>
  *in_stack_ffffffffffffff48;
  __normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff50;
  ASTSerializer *pAVar4;
  span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>
  *in_stack_ffffffffffffff58;
  ASTSerializer *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  int local_80;
  void *local_78;
  int local_70;
  void *local_68;
  int local_60;
  void *local_58;
  int local_50;
  void *local_48;
  __normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
  local_30;
  span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *local_28;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff60,
             (char *)in_stack_ffffffffffffff58);
  name._M_str = (char *)in_RSI;
  name._M_len = in_stack_ffffffffffffff68;
  ASTSerializer::startArray(in_stack_ffffffffffffff60,name);
  local_28 = &in_RDI->conditions;
  local_30._M_current =
       (Condition *)
       std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>::begin
                 (in_stack_ffffffffffffff48);
  std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>::end
            (in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
                      (in_stack_ffffffffffffff50,
                       (__normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff48);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
             ::operator*(&local_30);
    ASTSerializer::startObject((ASTSerializer *)0xa172a9);
    pAVar4 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff60,
               (char *)in_stack_ffffffffffffff58);
    pEVar3 = not_null<const_slang::ast::Expression_*>::operator*
                       ((not_null<const_slang::ast::Expression_*> *)0xa172d1);
    ASTSerializer::write(pAVar4,local_50,local_48,(size_t)pEVar3);
    if (pCVar2->pattern != (Pattern *)0x0) {
      in_stack_ffffffffffffff60 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)local_10,
                 (char *)in_stack_ffffffffffffff58);
      ASTSerializer::write(in_stack_ffffffffffffff60,local_60,local_58,(size_t)pCVar2->pattern);
    }
    ASTSerializer::endObject((ASTSerializer *)0xa1733c);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::ConditionalExpression::Condition_*,_std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  ASTSerializer::endArray((ASTSerializer *)0xa1735b);
  pAVar4 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff60,
             (char *)in_stack_ffffffffffffff58);
  pEVar3 = left(in_RDI);
  ASTSerializer::write(pAVar4,local_70,local_68,(size_t)pEVar3);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff60,
             (char *)local_10);
  pEVar3 = right(in_RDI);
  ASTSerializer::write(local_10,local_80,local_78,(size_t)pEVar3);
  return;
}

Assistant:

void ConditionalExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("conditions");
    for (auto& cond : conditions) {
        serializer.startObject();
        serializer.write("expr", *cond.expr);
        if (cond.pattern)
            serializer.write("pattern", *cond.pattern);
        serializer.endObject();
    }
    serializer.endArray();

    serializer.write("left", left());
    serializer.write("right", right());
}